

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

bool runtest<char>(char *inifile,char *expectedfile,basic_ostream<char,_std::char_traits<char>_> *os
                  )

{
  __type _Var1;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  Ini<char> ini;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  char *expectedfile_local;
  char *inifile_local;
  
  inipp::Ini<char>::Ini((Ini<char> *)((long)&actual.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,inifile,&local_b9);
  test<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,&local_b8
             ,(Ini<char> *)((long)&actual.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,expectedfile,&local_111);
  read_all<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 &local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::operator<<((ostream *)os,(string *)local_98);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f0);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_98);
  inipp::Ini<char>::~Ini((Ini<char> *)((long)&actual.field_2 + 8));
  return _Var1;
}

Assistant:

static inline bool runtest(const char *inifile, const char *expectedfile, std::basic_ostream<CharT> & os) {
	Ini<CharT> ini;
	auto actual = test(inifile, ini);
	auto expected = read_all<CharT>(expectedfile);
	os << actual;
	return (actual == expected);
}